

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O3

int main(int argc,char **argv)

{
  _Bool _Var1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t b_00;
  int iVar7;
  int iVar8;
  int i;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  char *pcVar12;
  long lVar13;
  byte bVar14;
  byte *pbVar15;
  ulong uVar16;
  bool bVar17;
  uint8_t a_3 [6];
  m256v A;
  uint8_t b [6];
  uint8_t s [6];
  uint8_t a [30];
  uint8_t a_4 [6];
  undefined4 local_cc;
  int local_c8;
  short local_c4;
  m256v local_c0;
  uint8_t local_a4 [6];
  int local_9e;
  short local_9a;
  m256v local_98;
  undefined6 uStack_80;
  m256v local_48;
  
  while( true ) {
    iVar7 = getopt(argc,argv,"h");
    if (iVar7 == -1) break;
    if (iVar7 == 0x3f) {
      exit(1);
    }
    if (iVar7 == 0x68) {
      usage();
      exit(0);
    }
  }
  puts("Running: test_get_el_offs()");
  m256v_make(&local_c0,7,0xb,(uint8_t *)&local_98);
  lVar13 = 0;
  uVar9 = 0;
  bVar17 = false;
  lVar10 = 0;
  do {
    uVar16 = 0;
    do {
      if (lVar10 != lVar13) {
        fprintf(_stderr,"  m256v_get_el_offs(A, %d, %d) = %zu\n",uVar9,uVar16 & 0xffffffff,
                lVar13 + uVar16);
        fprintf(_stderr,"  would have expected %zu.  A is %d rows x %d cols\n",lVar10 + uVar16,7,0xb
               );
        if (bVar17) goto LAB_00101295;
        iVar7 = 1;
        pcVar12 = "--> FAIL (test test_get_el_offs())";
        goto LAB_001012ae;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != 0xb);
    bVar17 = 5 < uVar9;
    uVar9 = uVar9 + 1;
    lVar13 = lVar13 + CONCAT71(local_c0.rstride._1_7_,(undefined1)local_c0.rstride);
    lVar10 = lVar10 + 0xb;
  } while (uVar9 != 7);
LAB_00101295:
  iVar7 = 0;
  pcVar12 = "--> pass";
LAB_001012ae:
  puts(pcVar12);
  puts("Running: test_el_access()");
  local_98.e._0_6_ = 0x20604080302;
  local_98.e._6_2_ = 0x406;
  uStack_80 = 0x70203080303;
  local_98.n_row = 0x1040103;
  local_98.n_col = 0x6020905;
  local_98.rstride._0_6_ = 0x70908050305;
  local_98.rstride._6_2_ = 0x309;
  m256v_make(&local_c0,6,5,(uint8_t *)&local_98);
  lVar10 = CONCAT71(local_c0.rstride._1_7_,(undefined1)local_c0.rstride);
  uVar9 = 0;
  pcVar12 = "diag";
  pbVar15 = local_c0.e;
  do {
    bVar11 = *pbVar15;
    bVar14 = (&DAT_0010463e)[uVar9];
    if (bVar14 != bVar11) goto LAB_001013e8;
    uVar9 = uVar9 + 1;
    pbVar15 = pbVar15 + lVar10 + 1;
  } while (uVar9 != 5);
  uVar9 = 0;
  pcVar12 = "first_row";
  do {
    bVar11 = local_c0.e[uVar9];
    bVar14 = (&DAT_00104643)[uVar9];
    if (bVar14 != bVar11) goto LAB_001013e8;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 5);
  uVar9 = 0;
  pcVar12 = "first_col";
  pbVar15 = local_c0.e;
  do {
    bVar11 = *pbVar15;
    bVar14 = (&DAT_00104648)[uVar9];
    if (bVar14 != bVar11) goto LAB_001013e8;
    uVar9 = uVar9 + 1;
    pbVar15 = pbVar15 + lVar10;
  } while (uVar9 != 6);
  pbVar15 = local_c0.e + 3;
  uVar9 = 0;
  pcVar12 = "col3";
  do {
    bVar11 = *pbVar15;
    bVar14 = (&DAT_0010464e)[uVar9];
    if (bVar14 != bVar11) goto LAB_001013e8;
    uVar9 = uVar9 + 1;
    pbVar15 = pbVar15 + lVar10;
  } while (uVar9 != 6);
  pcVar12 = "dzigzag";
  uVar16 = 0;
  do {
    uVar9 = uVar16;
    if (uVar9 == 10) {
      local_c0.e[lVar10 * 2 + 1] = 0x7b;
      uVar9 = 0;
      pcVar12 = "m_row2";
      goto LAB_0010143b;
    }
    bVar11 = local_c0.e[(uVar9 >> 1 & 0x7fffffff) + (uVar9 + 1 >> 1 & 0x7fffffff) * lVar10];
    bVar14 = (&DAT_00104654)[uVar9];
    uVar16 = uVar9 + 1;
  } while (bVar14 == bVar11);
LAB_001013e8:
  fprintf(_stderr,"Error in pattern `%s\', index %d:  Got %d, expected %d.\n",pcVar12,uVar9,
          (ulong)bVar11,(ulong)bVar14);
  puts("--> FAIL (test test_el_access())");
  iVar7 = iVar7 + 1;
  goto LAB_0010145d;
  while (uVar9 = uVar9 + 1, uVar9 != 5) {
LAB_0010143b:
    bVar11 = local_c0.e[uVar9 + CONCAT71(local_c0.rstride._1_7_,(undefined1)local_c0.rstride) * 2];
    bVar14 = (&DAT_0010465e)[uVar9];
    if (bVar14 != bVar11) goto LAB_001013e8;
  }
  puts("--> pass");
LAB_0010145d:
  puts("Running: test_swap_rows()");
  local_c0._0_6_ = 0x60500000000;
  local_c0.n_row = 0x4030201;
  m256v_make(&local_98,3,2,(uint8_t *)&local_c0);
  m256v_swap_rows(&local_98,1,2);
  if ((short)local_c0.n_col == 0x403 && local_c0.n_row == 0x6050201) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded row swap result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x65);
    puts("--> FAIL (test test_swap_rows())");
    iVar7 = iVar7 + 1;
  }
  puts("Running: test_clear_row()");
  local_c0._0_6_ = 0x60500000000;
  local_c0.n_row = 0x4030201;
  m256v_make(&local_98,3,2,(uint8_t *)&local_c0);
  m256v_clear_row(&local_98,1);
  if ((short)local_c0.n_col == 0x605 && local_c0.n_row == 0x201) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded row clear result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x79);
    puts("--> FAIL (test test_clear_row())");
    iVar7 = iVar7 + 1;
  }
  puts("Running: test_multadd_row()");
  local_c0._0_6_ = 0xa0968c82786e;
  m256v_make(&local_98,3,2,(uint8_t *)&local_c0);
  m256v_multadd_row(&local_98,1,'\r',&local_98,2);
  if ((short)local_c0.n_col == 0x3242 && local_c0.n_row == -0x737d8792) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded mult-add row result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x8d);
    puts("--> FAIL (test test_multadd_row())");
    iVar7 = iVar7 + 1;
  }
  puts("Running: test_iszero()");
  local_c0.rstride._0_1_ = 0;
  local_c0.n_row = 0;
  local_c0.n_col = 0;
  m256v_make(&local_98,3,3,(uint8_t *)&local_c0);
  iVar8 = m256v_iszero(&local_98);
  if (iVar8 != 0) {
    *(undefined1 *)
     (CONCAT26(local_98.e._6_2_,local_98.e._0_6_) + 1 +
     CONCAT26(local_98.rstride._6_2_,(undefined6)local_98.rstride)) = 1;
    iVar8 = m256v_iszero(&local_98);
    if (iVar8 == 0) {
      puts("--> pass");
      goto LAB_0010161d;
    }
  }
  puts("--> FAIL (test test_iszero())");
  iVar7 = iVar7 + 1;
LAB_0010161d:
  puts("Running: test_clear()");
  _Var1 = test_clear();
  if (_Var1) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_clear())");
    iVar7 = iVar7 + 1;
  }
  puts("Running: test_copy()");
  _Var1 = test_copy();
  if (_Var1) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_copy())");
    iVar7 = iVar7 + 1;
  }
  puts("Running: test_permute_rows()");
  _Var1 = test_permute_rows();
  if (_Var1) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_permute_rows())");
    iVar7 = iVar7 + 1;
  }
  puts("Running: test_permute_cols()");
  _Var1 = test_permute_cols();
  if (_Var1) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_permute_cols())");
    iVar7 = iVar7 + 1;
  }
  puts("Running: test_add()");
  local_c4 = 0x5e3d;
  local_c8 = 0xc593726;
  m256v_make(&local_98,3,2,(uint8_t *)&local_c8);
  builtin_memcpy(local_a4,"A.9V>\t",6);
  m256v_make(&local_c0,3,2,local_a4);
  m256v_make(&local_48,3,2,(uint8_t *)&local_9e);
  m256v_add(&local_98,&local_c0,&local_48);
  if (local_9a == 0x5703 && local_9e == 0x5a601967) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded sum result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x12e);
    puts("--> FAIL (test test_add())");
    iVar7 = iVar7 + 1;
  }
  puts("Running: test_add_inplace()");
  local_48.n_col._0_2_ = 0x5e3d;
  local_48.n_row = 0xc593726;
  m256v_make(&local_98,3,2,(uint8_t *)&local_48);
  local_c4 = 0x93e;
  local_c8 = 0x56392e41;
  m256v_make(&local_c0,3,2,(uint8_t *)&local_c8);
  m256v_add_inplace(&local_98,&local_c0);
  if (local_c4 == 0x5703 && local_c8 == 0x5a601967) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded sum result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x142);
    puts("--> FAIL (test test_add_inplace())");
    iVar7 = iVar7 + 1;
  }
  puts("Running: test_mul0()");
  local_c4 = 0x5e3d;
  local_c8 = 0xc593726;
  m256v_make(&local_98,2,3,(uint8_t *)&local_c8);
  builtin_memcpy(local_a4,"A.9V>\t",6);
  m256v_make(&local_c0,3,2,local_a4);
  m256v_make(&local_48,2,2,(uint8_t *)&local_9e);
  m256v_mul(&local_98,&local_c0,&local_48);
  uVar2 = gf256_mul('&','A');
  uVar3 = gf256_mul('7','9');
  uVar4 = gf256_mul('Y','>');
  uVar3 = gf256_add(uVar3,uVar4);
  uVar2 = gf256_add(uVar2,uVar3);
  uVar3 = gf256_mul('&','.');
  uVar4 = gf256_mul('7','V');
  uVar5 = gf256_mul('Y','\t');
  uVar4 = gf256_add(uVar4,uVar5);
  uVar3 = gf256_add(uVar3,uVar4);
  uVar4 = gf256_mul('\f','A');
  uVar5 = gf256_mul('=','9');
  uVar6 = gf256_mul('^','>');
  uVar5 = gf256_add(uVar5,uVar6);
  uVar4 = gf256_add(uVar4,uVar5);
  uVar5 = gf256_mul('\f','.');
  uVar6 = gf256_mul('=','V');
  b_00 = gf256_mul('^','\t');
  uVar6 = gf256_add(uVar6,b_00);
  uVar5 = gf256_add(uVar5,uVar6);
  local_cc = CONCAT13(uVar5,CONCAT12(uVar4,CONCAT11(uVar3,uVar2)));
  if (local_9e == local_cc) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded mul result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x160);
    puts("--> FAIL (test test_mul0())");
    iVar7 = iVar7 + 1;
  }
  puts("Running: test_mul()");
  _Var1 = test_mul();
  if (_Var1) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_mul())");
    iVar7 = iVar7 + 1;
  }
  return (uint)(iVar7 != 0);
}

Assistant:

int main(int argc, char** argv)
{
	/* Read cmdline args */
	int c;
	while ((c = getopt(argc, argv, "h")) != -1) {
		switch(c) {
		case 'h':
			usage();
			exit(EXIT_SUCCESS);
		case '?':
			exit(EXIT_FAILURE);
		};
	}

	int nfail = 0;
#define RUN_TEST(x) \
	do { \
		printf("Running: " #x "\n"); \
		if (!x) { \
			printf("--> FAIL (test " #x ")\n"); \
			++nfail; \
		} else { \
			printf("--> pass\n"); \
		} \
	} while(0)

	// Tests for the elementary ops on submatrices
	RUN_TEST(test_get_el_offs());
	RUN_TEST(test_el_access());
	RUN_TEST(test_swap_rows());
	RUN_TEST(test_clear_row());
	RUN_TEST(test_multadd_row());

	// Tests for the entire matrix
	RUN_TEST(test_iszero());
	RUN_TEST(test_clear());
	RUN_TEST(test_copy());
	RUN_TEST(test_permute_rows());
	RUN_TEST(test_permute_cols());
	RUN_TEST(test_add());
	RUN_TEST(test_add_inplace());
	RUN_TEST(test_mul0());
	RUN_TEST(test_mul());
#undef RUN_TEST

	return (nfail == 0 ? EXIT_SUCCESS : EXIT_FAILURE);
}